

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

QPainterPath __thiscall QPainterPath::toReversed(QPainterPath *this)

{
  uint uVar1;
  ElementType EVar2;
  QPainterPathPrivate *pQVar3;
  Element *pEVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  Element *pEVar8;
  QPainterPath *in_RSI;
  
  pQVar3 = (in_RSI->d_ptr).d.ptr;
  (this->d_ptr).d.ptr = (QPainterPathPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath(this);
  bVar6 = isEmpty(in_RSI);
  if (bVar6) {
    operator=(this,in_RSI);
  }
  else {
    pEVar4 = (pQVar3->elements).d.ptr;
    lVar5 = (pQVar3->elements).d.size;
    moveTo(this,pEVar4[lVar5 + -1].x,pEVar4[lVar5 + -1].y);
    uVar7 = (uint)(pQVar3->elements).d.size;
    while (uVar1 = uVar7 - 1, 0 < (int)uVar1) {
      pEVar4 = (pQVar3->elements).d.ptr;
      pEVar8 = pEVar4 + (uVar7 - 2);
      EVar2 = pEVar4[uVar1].type;
      if (EVar2 == MoveToElement) {
        moveTo(this,pEVar8->x,pEVar8->y);
        uVar7 = uVar1;
      }
      else if (EVar2 == CurveToDataElement) {
        uVar1 = uVar7 - 3;
        cubicTo(this,pEVar8->x,pEVar8->y,pEVar4[(int)uVar1].x,pEVar4[(int)uVar1].y,
                pEVar4[(int)(uVar7 - 4)].x,pEVar4[(int)(uVar7 - 4)].y);
        uVar7 = uVar1;
      }
      else {
        uVar7 = uVar1;
        if (EVar2 == LineToElement) {
          lineTo(this,pEVar8->x,pEVar8->y);
        }
      }
    }
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
}

Assistant:

QPainterPath QPainterPath::toReversed() const
{
    Q_D(const QPainterPath);
    QPainterPath rev;

    if (isEmpty()) {
        rev = *this;
        return rev;
    }

    rev.moveTo(d->elements.at(d->elements.size()-1).x, d->elements.at(d->elements.size()-1).y);

    for (int i=d->elements.size()-1; i>=1; --i) {
        const QPainterPath::Element &elm = d->elements.at(i);
        const QPainterPath::Element &prev = d->elements.at(i-1);
        switch (elm.type) {
        case LineToElement:
            rev.lineTo(prev.x, prev.y);
            break;
        case MoveToElement:
            rev.moveTo(prev.x, prev.y);
            break;
        case CurveToDataElement:
            {
                Q_ASSERT(i>=3);
                const QPainterPath::Element &cp1 = d->elements.at(i-2);
                const QPainterPath::Element &sp = d->elements.at(i-3);
                Q_ASSERT(prev.type == CurveToDataElement);
                Q_ASSERT(cp1.type == CurveToElement);
                rev.cubicTo(prev.x, prev.y, cp1.x, cp1.y, sp.x, sp.y);
                i -= 2;
                break;
            }
        default:
            Q_ASSERT(!"qt_reversed_path");
            break;
        }
    }
    //qt_debug_path(rev);
    return rev;
}